

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

void JHThread::Thread::Init(void)

{
  int iVar1;
  Thread *this;
  pthread_t thread;
  
  if (!mInited) {
    iVar1 = pthread_key_create(&mThreadKey,thread_key_destructor);
    if (iVar1 != 0) {
      jh_log_print(0,"static void JHThread::Thread::Init()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Thread.cpp"
                   ,0x7d,"Failed to create pthread key");
    }
    mInited = true;
    this = (Thread *)
           operator_new(0x38,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Thread.cpp"
                        ,0x81);
    thread = pthread_self();
    Thread(this,thread,"main");
    if (Mutex::mInited == false) {
      Mutex::mInited = true;
      pthread_mutex_init((pthread_mutex_t *)&Mutex::mCriticalSection,(pthread_mutexattr_t *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void Thread::Init()
{
#ifdef GCHEAP_ENABLED
	GCHeap::InitCheck();
#endif	
	
	if ( !mInited )
	{
		if ( pthread_key_create( &mThreadKey, &thread_key_destructor ) != 0 )
			LOG_ERR( "Failed to create pthread key" );
	
		mInited = true;
	
		jh_new Thread( pthread_self(), "main" );  // known to leak...
		Mutex::Init();
	}	
}